

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box_Hierarchy.h
# Opt level: O0

void __thiscall Nova::Box_Hierarchy<float,_2>::~Box_Hierarchy(Box_Hierarchy<float,_2> *this)

{
  Box_Hierarchy<float,_2> *this_local;
  
  this->_vptr_Box_Hierarchy = (_func_int **)&PTR__Box_Hierarchy_0017dab0;
  Clear(this);
  Array<Nova::Box_Hierarchy<float,_2>_*>::~Array(&this->children);
  Array<int>::~Array(&this->index);
  Box<float,_2>::~Box(&this->box);
  return;
}

Assistant:

virtual ~Box_Hierarchy()
    {Clear();}